

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

bool M_Responder(event_t *ev)

{
  BYTE BVar1;
  byte bVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  uint keynum;
  FName *menu;
  FButtonStatus *this;
  uint uVar8;
  bool bVar9;
  FName local_30;
  FName local_2c;
  
  if (chatmodeon != 0) goto LAB_0030ace6;
  if (menuactive == MENU_Off || DMenu::CurrentMenu == (DMenu *)0x0) {
    if (!MenuEnabled) goto LAB_0030ace6;
    if (ev->type == '\x04') {
      bVar7 = 0;
      if (((ev->subtype != '\a') || (ConsoleState == c_down)) || (m_use_mouse.Value == 0))
      goto LAB_0030ace8;
      M_StartControlPanel(true);
      menu = &local_30;
LAB_0030ae96:
      menu->Index = 499;
      M_SetMenu(menu,-1);
    }
    else {
      if (ev->type != '\x01') goto LAB_0030ace6;
      if (ev->data1 == 1) {
        M_StartControlPanel(true);
        menu = &local_2c;
        goto LAB_0030ae96;
      }
      bVar7 = 0;
      if ((ev->data1 != 0x3b) || (!devparm)) goto LAB_0030ace8;
      G_ScreenShot((char *)0x0);
    }
    goto LAB_0030b02a;
  }
  BVar1 = ev->type;
  if (BVar1 != '\x04') {
    uVar8 = 9;
    bVar4 = true;
    if (1 < (byte)(BVar1 - 1) || menuactive == MENU_WaitKey) {
LAB_0030ae36:
      bVar4 = true;
      keynum = 0;
      uVar8 = 9;
      bVar9 = false;
      goto LAB_0030ae56;
    }
    bVar9 = BVar1 == '\x02';
    sVar3 = ev->data1;
    keynum = (uint)sVar3;
    bVar5 = false;
    switch(sVar3) {
    case 0x19c:
    case 0x1ac:
    case 0x1b7:
switchD_0030ad7b_caseD_19c:
      uVar8 = 3;
      goto LAB_0030afa6;
    case 0x19d:
    case 0x1ad:
    case 0x1b6:
switchD_0030ad7b_caseD_19d:
      uVar8 = 2;
      goto LAB_0030afa6;
    case 0x19e:
    case 0x1ae:
    case 0x1b5:
switchD_0030ad7b_caseD_19e:
      uVar8 = 1;
      goto LAB_0030afa6;
    case 0x19f:
    case 0x1af:
    case 0x1b4:
switchD_0030ad7b_caseD_19f:
LAB_0030af40:
      bVar4 = false;
      bVar5 = true;
      uVar8 = 0;
      break;
    case 0x1a0:
    case 0x1a1:
    case 0x1a2:
    case 0x1a3:
    case 0x1a4:
    case 0x1a5:
    case 0x1a6:
    case 0x1a7:
    case 0x1a8:
    case 0x1a9:
    case 0x1aa:
    case 0x1ab:
    case 0x1b0:
    case 0x1b1:
    case 0x1b2:
    case 0x1b3:
    case 0x1b8:
    case 0x1b9:
    case 0x1ba:
    case 0x1bb:
    case 0x1be:
    case 0x1bf:
      break;
    case 0x1bc:
switchD_0030ad7b_caseD_1bc:
      uVar8 = 4;
      goto LAB_0030afa6;
    case 0x1bd:
switchD_0030ad7b_caseD_1bd:
      uVar8 = 5;
      goto LAB_0030afa6;
    case 0x1c0:
switchD_0030ad7b_caseD_1c0:
      uVar8 = 6;
      goto LAB_0030ae54;
    case 0x1c1:
switchD_0030ad7b_caseD_1c1:
      uVar8 = 7;
      goto LAB_0030ae54;
    case 0x1c2:
switchD_0030ad7b_caseD_1c2:
      uVar8 = 8;
      goto LAB_0030ae54;
    default:
      bVar5 = false;
      switch(sVar3) {
      case 0x108:
        goto switchD_0030ad7b_caseD_1c1;
      case 0x109:
        goto switchD_0030ad7b_caseD_1c0;
      case 0x10a:
        goto switchD_0030ad7b_caseD_1c2;
      case 0x10b:
      case 0x10e:
      case 0x10f:
        break;
      case 0x10c:
        goto switchD_0030ad7b_caseD_1bc;
      case 0x10d:
        goto switchD_0030ad7b_caseD_1bd;
      case 0x110:
        goto switchD_0030ad7b_caseD_19f;
      case 0x111:
        goto switchD_0030ad7b_caseD_19e;
      case 0x112:
        goto switchD_0030ad7b_caseD_19d;
      case 0x113:
        goto switchD_0030ad7b_caseD_19c;
      default:
        switch(sVar3) {
        case 0x188:
          goto switchD_0030ad7b_caseD_19f;
        case 0x189:
          goto switchD_0030ad7b_caseD_19c;
        case 0x18a:
          goto switchD_0030ad7b_caseD_19e;
        case 0x18b:
          goto switchD_0030ad7b_caseD_19d;
        }
      }
    }
    goto switchD_0030ad7b_caseD_1a0;
  }
  bVar2 = ev->subtype;
  bVar7 = 1;
  if (0x13 < bVar2) {
    if (1 < bVar2 - 0x14) {
LAB_0030aef6:
      if ((0x13 < (byte)(bVar2 - 5)) || (m_use_mouse.Value != 0)) goto LAB_0030af09;
      goto LAB_0030ace8;
    }
    bVar9 = bVar2 == 0x15;
    uVar8 = 7;
    keynum = 0;
    goto LAB_0030ae54;
  }
  if (bVar2 != 1) {
    if (bVar2 == 2) goto LAB_0030ace8;
    if (bVar2 != 3) goto LAB_0030aef6;
  }
  iVar6 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xc])();
  bVar4 = true;
  if ((char)iVar6 == '\0') goto LAB_0030ae36;
  keynum = (uint)(ushort)ev->data1;
  bVar9 = ev->subtype == '\x03';
  switch(keynum) {
  case 1:
    uVar8 = 5;
    keynum = 1;
    break;
  case 2:
    uVar8 = 4;
    keynum = 2;
    break;
  case 3:
  case 4:
  case 7:
  case 9:
  case 0xc:
switchD_0030ae21_caseD_3:
    if (ev->subtype != '\x03') {
LAB_0030af09:
      iVar6 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])(DMenu::CurrentMenu,ev);
      return SUB41(iVar6,0);
    }
    keynum = (uint)ev->data1;
    bVar5 = false;
    uVar8 = 9;
    goto switchD_0030ad7b_caseD_1a0;
  case 5:
    uVar8 = 2;
    keynum = 5;
    break;
  case 6:
    uVar8 = 3;
    keynum = 6;
    break;
  case 8:
    keynum = 8;
    bVar4 = false;
    bVar5 = false;
    uVar8 = 8;
    goto switchD_0030ad7b_caseD_1a0;
  case 10:
    uVar8 = 1;
    keynum = 10;
    break;
  case 0xb:
    keynum = 0xb;
    goto LAB_0030af40;
  case 0xd:
    uVar8 = 6;
    keynum = 0xd;
    goto LAB_0030ae54;
  default:
    uVar8 = 7;
    if (keynum != 0x1e) {
      if (keynum != 0x1b) goto switchD_0030ae21_caseD_3;
      keynum = 0x1b;
    }
LAB_0030ae54:
    bVar4 = false;
LAB_0030ae56:
    bVar5 = false;
    goto switchD_0030ad7b_caseD_1a0;
  }
LAB_0030afa6:
  bVar5 = true;
  bVar4 = false;
switchD_0030ad7b_caseD_1a0:
  if (bVar4) {
    iVar6 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])(DMenu::CurrentMenu,ev);
    bVar7 = bVar9 ^ 1U | (byte)iVar6;
  }
  else {
    this = (FButtonStatus *)((long)MenuButtons[0].Keys + (ulong)(uVar8 << 4));
    if (bVar9 == false) {
      FButtonStatus::PressKey(this,keynum);
      MenuButtonOrigin[uVar8] = BVar1 != '\x04';
      if (bVar5) {
        MenuButtonTickers[uVar8] = 0xe;
      }
      (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[8])
                (DMenu::CurrentMenu,(ulong)uVar8,(ulong)(BVar1 != '\x04'));
LAB_0030b02a:
      bVar7 = 1;
    }
    else {
      FButtonStatus::ReleaseKey(this,keynum);
LAB_0030ace6:
      bVar7 = 0;
    }
  }
LAB_0030ace8:
  return (bool)(bVar7 & 1);
}

Assistant:

bool M_Responder (event_t *ev) 
{ 
	int ch = 0;
	bool keyup = false;
	int mkey = NUM_MKEYS;
	bool fromcontroller = true;

	if (chatmodeon)
	{
		return false;
	}

	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		// There are a few input sources we are interested in:
		//
		// EV_KeyDown / EV_KeyUp : joysticks/gamepads/controllers
		// EV_GUI_KeyDown / EV_GUI_KeyUp : the keyboard
		// EV_GUI_Char : printable characters, which we want in string input mode
		//
		// This code previously listened for EV_GUI_KeyRepeat to handle repeating
		// in the menus, but that doesn't work with gamepads, so now we combine
		// the multiple inputs into buttons and handle the repetition manually.
		if (ev->type == EV_GUI_Event)
		{
			fromcontroller = false;
			if (ev->subtype == EV_GUI_KeyRepeat)
			{
				// We do our own key repeat handling but still want to eat the
				// OS's repeated keys.
				return true;
			}
			else if (ev->subtype == EV_GUI_BackButtonDown || ev->subtype == EV_GUI_BackButtonUp)
			{
				mkey = MKEY_Back;
				keyup = ev->subtype == EV_GUI_BackButtonUp;
			}
			else if (ev->subtype != EV_GUI_KeyDown && ev->subtype != EV_GUI_KeyUp)
			{
				// do we want mouse input?
				if (ev->subtype >= EV_GUI_FirstMouseEvent && ev->subtype <= EV_GUI_LastMouseEvent)
				{
						if (!m_use_mouse)
							return true;
				}

				// pass everything else on to the current menu
				return DMenu::CurrentMenu->Responder(ev);
			}
			else if (DMenu::CurrentMenu->TranslateKeyboardEvents())
			{
				ch = ev->data1;
				keyup = ev->subtype == EV_GUI_KeyUp;
				switch (ch)
				{
				case GK_BACK:			mkey = MKEY_Back;		break;
				case GK_ESCAPE:			mkey = MKEY_Back;		break;
				case GK_RETURN:			mkey = MKEY_Enter;		break;
				case GK_UP:				mkey = MKEY_Up;			break;
				case GK_DOWN:			mkey = MKEY_Down;		break;
				case GK_LEFT:			mkey = MKEY_Left;		break;
				case GK_RIGHT:			mkey = MKEY_Right;		break;
				case GK_BACKSPACE:		mkey = MKEY_Clear;		break;
				case GK_PGUP:			mkey = MKEY_PageUp;		break;
				case GK_PGDN:			mkey = MKEY_PageDown;	break;
				default:
					if (!keyup)
					{
						return DMenu::CurrentMenu->Responder(ev);
					}
					break;
				}
			}
		}
		else if (menuactive != MENU_WaitKey && (ev->type == EV_KeyDown || ev->type == EV_KeyUp))
		{
			keyup = ev->type == EV_KeyUp;

			ch = ev->data1;
			switch (ch)
			{
			case KEY_JOY2:
//			case KEY_JOY3:
//			case KEY_JOY15:
			case KEY_PAD_A:
				mkey = MKEY_Enter;
				break;

			case KEY_JOY1:
//			case KEY_JOY14:
			case KEY_PAD_B:
				mkey = MKEY_Back;
				break;

//			case KEY_JOY4:
			case KEY_JOY3:
			case KEY_PAD_X:
				mkey = MKEY_Clear;
				break;

			case KEY_JOY5:
			case KEY_PAD_LSHOULDER:
				mkey = MKEY_PageUp;
				break;

			case KEY_JOY6:
			case KEY_PAD_RSHOULDER:
				mkey = MKEY_PageDown;
				break;

			case KEY_PAD_DPAD_UP:
			case KEY_PAD_LTHUMB_UP:
			case KEY_JOYAXIS2MINUS:
			case KEY_JOYPOV1_UP:
			case KEY_JOY9:
				mkey = MKEY_Up;
				break;

			case KEY_PAD_DPAD_DOWN:
			case KEY_PAD_LTHUMB_DOWN:
			case KEY_JOYAXIS2PLUS:
			case KEY_JOYPOV1_DOWN:
			case KEY_JOY10:
				mkey = MKEY_Down;
				break;

			case KEY_PAD_DPAD_LEFT:
			case KEY_PAD_LTHUMB_LEFT:
			case KEY_JOYAXIS1MINUS:
			case KEY_JOYPOV1_LEFT:
			case KEY_JOY11:
				mkey = MKEY_Left;
				break;

			case KEY_PAD_DPAD_RIGHT:
			case KEY_PAD_LTHUMB_RIGHT:
			case KEY_JOYAXIS1PLUS:
			case KEY_JOYPOV1_RIGHT:
			case KEY_JOY12:
				mkey = MKEY_Right;
				break;
			}
		}

		if (mkey != NUM_MKEYS)
		{
			if (keyup)
			{
				MenuButtons[mkey].ReleaseKey(ch);
				return false;
			}
			else
			{
				MenuButtons[mkey].PressKey(ch);
				MenuButtonOrigin[mkey] = fromcontroller;
				if (mkey <= MKEY_PageDown)
				{
					MenuButtonTickers[mkey] = KEY_REPEAT_DELAY;
				}
				DMenu::CurrentMenu->MenuEvent(mkey, fromcontroller);
				return true;
			}
		}
		return DMenu::CurrentMenu->Responder(ev) || !keyup;
	}
	else if (MenuEnabled)
	{
		if (ev->type == EV_KeyDown)
		{
			// Pop-up menu?
			if (ev->data1 == KEY_ESCAPE)
			{
				M_StartControlPanel(true);
				M_SetMenu(NAME_Mainmenu, -1);
				return true;
			}
			// If devparm is set, pressing F1 always takes a screenshot no matter
			// what it's bound to. (for those who don't bother to read the docs)
			if (devparm && ev->data1 == KEY_F1)
			{
				G_ScreenShot(NULL);
				return true;
			}
			return false;
		}
		else if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_LButtonDown && 
				 ConsoleState != c_down && m_use_mouse)
		{
			M_StartControlPanel(true);
			M_SetMenu(NAME_Mainmenu, -1);
			return true;
		}
	}
	return false;
}